

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitRefEq(FunctionValidator *this,RefEq *curr)

{
  ulong uVar1;
  Shareability left;
  Shareability right;
  Type local_38;
  Type eqref;
  HeapType local_28;
  
  wasm::Type::Type(&local_38,(HeapType)0x28,Nullable,Inexact);
  shouldBeTrue<wasm::RefEq*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "ref.eq requires gc [--enable-gc]");
  shouldBeSubTypeIgnoringShared
            (this,(Type)(curr->left->type).id,local_38,curr->left,
             "ref.eq\'s left argument should be a subtype of eqref");
  shouldBeSubTypeIgnoringShared
            (this,(Type)(curr->right->type).id,local_38,curr->right,
             "ref.eq\'s right argument should be a subtype of eqref");
  uVar1 = (curr->left->type).id;
  if (((uVar1 & 1) == 0 && 6 < uVar1) &&
     (uVar1 = (curr->right->type).id, (uVar1 & 1) == 0 && 6 < uVar1)) {
    eqref.id = (uintptr_t)wasm::Type::getHeapType(&curr->left->type);
    left = HeapType::getShared((HeapType *)&eqref);
    local_28 = wasm::Type::getHeapType(&curr->right->type);
    right = HeapType::getShared(&local_28);
    shouldBeEqual<wasm::RefEq*,wasm::Shareability>
              (this,left,right,curr,"ref.eq operands must have the same shareability");
  }
  return;
}

Assistant:

void FunctionValidator::visitRefEq(RefEq* curr) {
  Type eqref = Type(HeapType::eq, Nullable);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.eq requires gc [--enable-gc]");
  shouldBeSubTypeIgnoringShared(
    curr->left->type,
    eqref,
    curr->left,
    "ref.eq's left argument should be a subtype of eqref");
  shouldBeSubTypeIgnoringShared(
    curr->right->type,
    eqref,
    curr->right,
    "ref.eq's right argument should be a subtype of eqref");
  if (curr->left->type.isRef() && curr->right->type.isRef()) {
    shouldBeEqual(curr->left->type.getHeapType().getShared(),
                  curr->right->type.getHeapType().getShared(),
                  curr,
                  "ref.eq operands must have the same shareability");
  }
}